

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O2

void __thiscall expr_md_array_Test::TestBody(expr_md_array_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar1;
  bool bVar2;
  int iVar3;
  Generator *this_00;
  Var *pVVar4;
  Var *pVVar5;
  Var *pVVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar7;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  undefined1 local_1f0 [8];
  Context context;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  undefined1 local_c0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_a0 [32];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  allocator_type local_39;
  AssertHelper local_38;
  
  kratos::Context::Context((Context *)local_1f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"mod",(allocator<char> *)&local_80);
  this_00 = kratos::Context::generator((Context *)local_1f0,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"a",(allocator<char> *)(local_a0 + 0x18));
  local_38.data_ = (AssertHelperData *)0x200000004;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,__l,&local_39);
  pVVar4 = kratos::Generator::var
                     (this_00,(string *)local_60,0x10,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)local_60);
  (*(pVVar4->super_IRNode)._vptr_IRNode[0x19])(pVVar4,0);
  local_80._M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_60,"a.size()[0]","4",
             (pVVar4->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start,(int *)&local_80);
  if ((string)local_60[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x164,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_80._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  local_80._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_60,"a.size()[1]","2",
             (pVVar4->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + 1,(int *)&local_80);
  if ((string)local_60[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x165,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_80._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"b",(allocator<char> *)(local_a0 + 0x18));
  local_38.data_ = (AssertHelperData *)0x200000004;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,__l_00,&local_39);
  pVVar5 = kratos::Generator::var
                     (this_00,(string *)local_60,0x10,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"c",(allocator<char> *)(local_a0 + 0x18));
  local_38.data_ = (AssertHelperData *)0x200000004;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_38;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80,__l_01,&local_39);
  pVVar6 = kratos::Generator::var
                     (this_00,(string *)local_60,0x10,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_80);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)local_60);
  puVar1 = &gtest_ar.message_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_60 = (undefined1  [8])puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    kratos::Var::assign((Var *)&context.tracked_generators_._M_h._M_single_bucket,pVVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c8);
  }
  std::__cxx11::string::assign(local_60);
  testing::Message::Message((Message *)&local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x169,(char *)local_60);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_80._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
  }
  std::__cxx11::string::~string((string *)local_60);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_60 = (undefined1  [8])puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,0);
    (*(pVVar5->super_IRNode)._vptr_IRNode[9])(pVVar5,0);
    kratos::Var::assign((Var *)local_c0,(Var *)CONCAT44(extraout_var,iVar3));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c0 + 8));
  }
  std::__cxx11::string::assign(local_60);
  testing::Message::Message((Message *)&local_80);
  testing::internal::AssertHelper::AssertHelper
            (&local_38,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x16a,(char *)local_60);
  testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_80._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))();
  }
  std::__cxx11::string::~string((string *)local_60);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_60 = (undefined1  [8])puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar4->super_IRNode)._vptr_IRNode[9])(pVVar4,0);
    pVVar4 = (Var *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x48))
                              ((long *)CONCAT44(extraout_var_00,iVar3),0);
    iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[9])(pVVar5,0);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x48))
              ((long *)CONCAT44(extraout_var_01,iVar3),0);
    kratos::Var::assign((Var *)(local_c0 + 0x10),pVVar4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  }
  std::__cxx11::string::~string((string *)local_60);
  iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,1);
  local_80._M_impl.super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_60,"slice.size()[1]","2",
             (uint *)(*(long *)(CONCAT44(extraout_var_02,iVar3) + 0xa0) + 4),(int *)&local_80);
  if ((string)local_60[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_80);
    if (gtest_ar._0_8_ == 0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x16d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_80._M_impl.super__Vector_impl_data._M_start._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_80._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_80._M_impl.super__Vector_impl_data._M_start._0_4_) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  local_60 = (undefined1  [8])puVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    iVar3 = (*(pVVar5->super_IRNode)._vptr_IRNode[8])(pVVar5,1);
    (*(pVVar6->super_IRNode)._vptr_IRNode[8])(pVVar6,1);
    kratos::Var::assign((Var *)local_a0,(Var *)CONCAT44(extraout_var_03,iVar3));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a0 + 8));
  }
  std::__cxx11::string::~string((string *)local_60);
  kratos::Context::~Context((Context *)local_1f0);
  return;
}

Assistant:

TEST(expr, md_array) {  // NOLINT
    Context context;
    auto &mod = context.generator("mod");
    auto &a = mod.var("a", 16, {4, 2});
    a.set_is_packed(false);
    EXPECT_EQ(a.size()[0], 4);
    EXPECT_EQ(a.size()[1], 2);
    auto &b = mod.var("b", 16, {4, 2});
    auto &c = mod.var("c", 16, {4, 2});
    // mixture packed and unpacked
    EXPECT_THROW(a.assign(b), StmtException);
    EXPECT_THROW(a[0].assign(b[0]), StmtException);
    EXPECT_NO_THROW(a[0][0].assign(b[0][0]));
    auto &slice = b[{1, 0}];
    EXPECT_EQ(slice.size()[1], 2);
    EXPECT_NO_THROW((b[{1, 0}].assign(c[{1, 0}])));
}